

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.h
# Opt level: O0

int __thiscall vec<2UL,_int>::operator[](vec<2UL,_int> *this,size_t i)

{
  int local_2c;
  size_t i_local;
  vec<2UL,_int> *this_local;
  
  if (i < 2) {
    if (i == 0) {
      local_2c = this->x;
    }
    else {
      local_2c = this->y;
    }
    return local_2c;
  }
  __assert_fail("i >= 0 && i < 2",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cdgiessen[P]TinyRenderer/ext/geometry.h"
                ,0x76,"T vec<2, int>::operator[](const size_t) const [n = 2, T = int]");
}

Assistant:

T operator[](const size_t i) const
    {
        assert(i >= 0 && i < 2);
        return i == 0 ? x : y;
    }